

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  AInventory *pAVar4;
  char *pcVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042d1ef;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          pAVar4 = (AInventory *)param[1].field_0.field_1.a;
          if (pAVar4 == (AInventory *)0x0) {
            NullParam("\"item\"");
            pAVar4 = (AInventory *)param[1].field_0.field_1.a;
          }
          pPVar1 = AInventory::RegistrationInfo.MyClass;
          if (pAVar4 != (AInventory *)0x0) {
            if ((pAVar4->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar4);
              (pAVar4->super_AActor).super_DThinker.super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (pAVar4->super_AActor).super_DThinker.super_DObject.Class;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar6) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar6 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar6) {
              pcVar5 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
              goto LAB_0042d20e;
            }
          }
          pAVar4 = AActor::DropInventory(this,pAVar4);
          if (numret < 1) {
            iVar2 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x419,
                            "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar2 = 1;
            VMReturn::SetPointer(ret,pAVar4,1);
          }
          return iVar2;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0042d20e:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x418,
                    "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042d1ef:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x417,
                "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_OBJECT(self->DropInventory(item));
}